

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

int xml_parse_data(ly_ctx *ctx,lyxml_elem *xml,lyd_node *parent,lyd_node *first_sibling,
                  lyd_node *prev,int options,unres_data *unres,lyd_node **result,
                  lyd_node **act_notif)

{
  LYS_NODE LVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  lyxml_elem *plVar5;
  int iVar6;
  int iVar7;
  lys_module *plVar8;
  lyd_node *plVar9;
  LY_ERR *pLVar10;
  char *pcVar11;
  lys_node *plVar12;
  LY_VLOG_ELEM elem_type;
  bool bVar13;
  lyd_node **local_138;
  char *local_108;
  char *local_100;
  char *local_c8;
  char *str;
  int local_b8;
  int ret;
  int found;
  int filterflag;
  int pos;
  int editbits;
  int r;
  int havechildren;
  int j;
  int i;
  lyxml_elem *next;
  lyxml_elem *child;
  lyxml_attr *attr;
  lyd_attr *dattr_iter;
  lyd_attr *dattr;
  lys_node_augment *aug;
  lys_node *target;
  lys_node *schema;
  lyd_node *dlast;
  lyd_node *diter;
  lys_module *mod;
  lyd_node *plStack_38;
  int options_local;
  lyd_node *prev_local;
  lyd_node *first_sibling_local;
  lyd_node *parent_local;
  lyxml_elem *xml_local;
  ly_ctx *ctx_local;
  
  diter = (lyd_node *)0x0;
  target = (lys_node *)0x0;
  filterflag = 0;
  bVar4 = false;
  str._4_4_ = 0;
  mod._4_4_ = options;
  plStack_38 = prev;
  prev_local = first_sibling;
  first_sibling_local = parent;
  parent_local = (lyd_node *)xml;
  xml_local = (lyxml_elem *)ctx;
  if (xml == (lyxml_elem *)0x0) {
    __assert_fail("xml",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                  ,0x77,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (result == (lyd_node **)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                  ,0x78,
                  "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                 );
  }
  *result = (lyd_node *)0x0;
  if ((xml->flags & 1U) != 0) {
    if ((options & 0x200U) != 0) {
      ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"XML element with mixed content");
      return -1;
    }
    return 0;
  }
  if ((xml->ns == (lyxml_ns *)0x0) || (xml->ns->value == (char *)0x0)) {
    if ((options & 0x200U) != 0) {
      ly_vlog(LYE_XML_MISS,LY_VLOG_XML,xml,"element\'s","namespace");
      return -1;
    }
    return 0;
  }
  if (parent == (lyd_node *)0x0) {
    diter = (lyd_node *)ly_ctx_get_module_by_ns(ctx,xml->ns->value,(char *)0x0);
    if (xml_local[0x156].content != (char *)0x0) {
      if ((lys_module *)diter == (lys_module *)0x0) {
        diter = (lyd_node *)
                (*(code *)xml_local[0x156].content)
                          (xml_local,0,(parent_local[1].schema)->ext,0,
                           *(undefined8 *)(xml_local + 0x157));
      }
      else if (-1 < (char)((lys_module *)diter)->field_0x40) {
        diter = (lyd_node *)
                (*(code *)xml_local[0x156].content)
                          (xml_local,((lys_module *)diter)->name,((lys_module *)diter)->ns,1,
                           *(undefined8 *)(xml_local + 0x157));
      }
    }
    if (((diter != (lyd_node *)0x0) && ((char)diter[1].validity < '\0')) &&
       (((diter[1].validity >> 6 & 1) == 0 &&
        (target = xml_data_search_schemanode
                            ((lyxml_elem *)parent_local,(lys_node *)diter[2].child,mod._4_4_),
        target == (lys_node *)0x0)))) {
      for (r = 0; r < (int)(uint)*(byte *)&diter[1].attr; r = r + 1) {
        dattr = (lyd_attr *)((long)diter[2].attr + (long)r * 0x68);
        aug = (lys_node_augment *)dattr[1].value_str;
        if ((aug->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN) {
          while( true ) {
            bVar13 = false;
            if (aug != (lys_node_augment *)0x0) {
              bVar13 = (aug->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
            }
            if (!bVar13) break;
            aug = (lys_node_augment *)lys_parent((lys_node *)aug);
          }
          if (aug == (lys_node_augment *)0x0) {
            do {
              target = lys_getnext(target,(lys_node *)dattr,(lys_module *)0x0,0);
              if (target == (lys_node *)0x0) break;
            } while ((lyd_node *)target->name != parent_local->child);
          }
        }
        if (target != (lys_node *)0x0) break;
      }
    }
  }
  else {
    target = xml_data_search_schemanode(xml,parent->schema->child,options);
    if (((target != (lys_node *)0x0) &&
        (plVar8 = lys_node_module(target), plVar5 = xml_local, -1 < (char)plVar8->field_0x40)) &&
       (xml_local[0x156].content != (char *)0x0)) {
      pcVar2 = (code *)xml_local[0x156].content;
      plVar8 = lys_node_module(target);
      pcVar11 = plVar8->name;
      plVar8 = lys_node_module(target);
      (*pcVar2)(plVar5,pcVar11,plVar8->ns,1,*(undefined8 *)(xml_local + 0x157));
    }
  }
  diter = (lyd_node *)lys_node_module(target);
  if ((((lys_module *)diter == (lys_module *)0x0) || (-1 < (char)((lys_module *)diter)->field_0x40))
     || (((byte)((lys_module *)diter)->field_0x40 >> 6 & 1) != 0)) {
    if ((mod._4_4_ & 0x200) != 0) {
      elem_type = LY_VLOG_NONE;
      if (first_sibling_local != (lyd_node *)0x0) {
        elem_type = LY_VLOG_LYD;
      }
      ly_vlog(LYE_INELEM,elem_type,first_sibling_local,parent_local->child);
      return -1;
    }
    return 0;
  }
  LVar1 = target->nodetype;
  if (LVar1 == LYS_CONTAINER) {
LAB_00153a4e:
    plVar9 = (lyd_node *)calloc(1,0x38);
    *result = plVar9;
    editbits = 1;
  }
  else if ((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) {
    plVar9 = (lyd_node *)calloc(1,0x48);
    *result = plVar9;
    editbits = 0;
  }
  else {
    if (LVar1 == LYS_LIST) goto LAB_00153a4e;
    if (LVar1 != LYS_ANYXML) {
      if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_ACTION)) goto LAB_00153a4e;
      if (LVar1 != LYS_ANYDATA) {
        pLVar10 = ly_errno_location();
        *pLVar10 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
               ,0xe2);
        return -1;
      }
    }
    plVar9 = (lyd_node *)calloc(1,0x40);
    *result = plVar9;
    editbits = 0;
  }
  if (*result == (lyd_node *)0x0) {
    pLVar10 = ly_errno_location();
    *pLVar10 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","xml_parse_data");
    return -1;
  }
  (*result)->prev = *result;
  (*result)->schema = target;
  (*result)->parent = first_sibling_local;
  dlast = (lyd_node *)0x0;
  if (((first_sibling_local != (lyd_node *)0x0) && (first_sibling_local->child != (lyd_node *)0x0))
     && ((target->nodetype == LYS_LEAF &&
         ((first_sibling_local->schema->nodetype == LYS_LIST &&
          (iVar6 = lys_is_key((lys_node_list *)first_sibling_local->schema,(lys_node_leaf *)target),
          iVar6 != 0)))))) {
    havechildren = 0;
    dlast = first_sibling_local->child;
    while( true ) {
      bVar13 = false;
      if (((dlast != (lyd_node *)0x0) && (bVar13 = false, havechildren < iVar6 + -1)) &&
         (bVar13 = false, dlast->schema->nodetype == LYS_LEAF)) {
        iVar7 = lys_is_key((lys_node_list *)first_sibling_local->schema,
                           (lys_node_leaf *)dlast->schema);
        bVar13 = iVar7 != 0;
      }
      if (!bVar13) break;
      havechildren = havechildren + 1;
      dlast = dlast->next;
    }
    if (dlast != (lyd_node *)0x0) {
      if ((mod._4_4_ & 0x200) != 0) {
        ly_vlog(LYE_INORDER,LY_VLOG_LYD,*result,target->name,dlast->schema->name);
        ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "Invalid position of the key \"%s\" in a list \"%s\".",target->name,
                first_sibling_local->schema->name);
        free(*result);
        *result = (lyd_node *)0x0;
        return -1;
      }
      if ('\0' < ly_log_level) {
        ly_log(LY_LLWRN,"Invalid position of the key \"%s\" in a list \"%s\".",target->name,
               first_sibling_local->schema->name);
      }
      if (first_sibling_local->child == dlast) {
        first_sibling_local->child = *result;
        prev_local = *result;
      }
      if (dlast->prev->next != (lyd_node *)0x0) {
        dlast->prev->next = *result;
      }
      (*result)->prev = dlast->prev;
      dlast->prev = *result;
      (*result)->next = dlast;
    }
  }
  if (dlast == (lyd_node *)0x0) {
    if ((first_sibling_local != (lyd_node *)0x0) && (first_sibling_local->child == (lyd_node *)0x0))
    {
      first_sibling_local->child = *result;
    }
    if (plStack_38 == (lyd_node *)0x0) {
      (*result)->prev = *result;
      prev_local = *result;
    }
    else {
      (*result)->prev = plStack_38;
      plStack_38->next = *result;
      prev_local->prev = *result;
    }
  }
  iVar6 = ly_new_node_validity((*result)->schema);
  (*result)->validity = (uint8_t)iVar6;
  iVar6 = resolve_applies_when(target,0,(lys_node *)0x0);
  if (iVar6 != 0) {
    (*result)->field_0x9 = (*result)->field_0x9 & 0xf1 | 8;
  }
  for (child = (lyxml_elem *)parent_local->attr; child != (lyxml_elem *)0x0; child = child->parent)
  {
    if (*(int *)child == 1) {
      if (child->attr == (lyxml_attr *)0x0) {
        if ((((*result)->schema->nodetype == LYS_ANYXML) &&
            (iVar6 = ly_strequal_((*result)->schema->name,"filter"), iVar6 != 0)) &&
           ((iVar6 = ly_strequal_((*result)->schema->module->name,"ietf-netconf"), iVar6 != 0 ||
            (iVar6 = ly_strequal_((*result)->schema->module->name,"notifications"), iVar6 != 0)))) {
          local_c8 = "urn:ietf:params:xml:ns:netconf:base:1.0";
          bVar4 = true;
          goto LAB_00153f36;
        }
      }
      else {
        local_c8 = child->attr->value;
LAB_00153f36:
        pos = lyp_fill_attr((ly_ctx *)xml_local,*result,local_c8,(char *)0x0,&child->child->flags,
                            &child->next->flags,(lyxml_elem *)parent_local,&dattr_iter);
        if (pos == -1) goto LAB_00154981;
        if (pos != 1) {
          if ((bVar4) && (iVar6 = strcmp(&child->child->flags,"select"), iVar6 == 0)) {
            pcVar11 = transform_xml2json((ly_ctx *)xml_local,dattr_iter->value_str,
                                         (lyxml_elem *)parent_local,0,1);
            (dattr_iter->value).binary = pcVar11;
            if ((dattr_iter->value).binary == (char *)0x0) {
              dattr_iter->value = (lyd_val)dattr_iter->value_str;
              goto LAB_00154981;
            }
            lydict_remove((ly_ctx *)xml_local,dattr_iter->value_str);
            dattr_iter->value_str = (char *)dattr_iter->value;
          }
          if ((*result)->attr == (lyd_attr *)0x0) {
            (*result)->attr = dattr_iter;
          }
          else {
            for (attr = (lyxml_attr *)(*result)->attr; attr->next != (lyxml_attr *)0x0;
                attr = attr->next) {
            }
            attr->next = (lyxml_attr *)dattr_iter;
          }
          goto LAB_0015416e;
        }
      }
      if ((mod._4_4_ & 0x200) != 0) {
        if (child->attr == (lyxml_attr *)0x0) {
          local_100 = "<none>";
        }
        else {
          local_100 = child->attr->name;
        }
        ly_vlog(LYE_INMETA,LY_VLOG_LYD,*result,local_100,child->child,child->next);
        goto LAB_00154981;
      }
      if ('\0' < ly_log_level) {
        if (child->attr == (lyxml_attr *)0x0) {
          local_108 = "<none>";
        }
        else {
          local_108 = child->attr->name;
        }
        ly_log(LY_LLWRN,"Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",local_108,
               child->child,child->next);
      }
    }
LAB_0015416e:
  }
  if ((mod._4_4_ & 8) == 0) {
    if (!bVar4) goto LAB_0015450b;
    local_b8 = 0;
    for (attr = (lyxml_attr *)(*result)->attr; attr != (lyxml_attr *)0x0; attr = attr->next) {
      iVar6 = strcmp(attr->name,"type");
      if (iVar6 == 0) {
        if (((local_b8 == 1) || (local_b8 == 2)) || (local_b8 == 4)) {
          ly_vlog(LYE_TOOMANY,LY_VLOG_LYD,*result,"type",parent_local->child);
          goto LAB_00154981;
        }
        if (*(int *)(*(long *)(attr + 1) + 0x1c) == 0) {
          if (local_b8 == 3) {
            ly_vlog(LYE_INATTR,LY_VLOG_LYD,*result,attr->name);
            goto LAB_00154981;
          }
          if (local_b8 != 0) {
            __assert_fail("!found",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                          ,0x175,
                          "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                         );
          }
          local_b8 = 1;
        }
        else {
          if (*(int *)(*(long *)(attr + 1) + 0x1c) != 1) {
            pLVar10 = ly_errno_location();
            *pLVar10 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                   ,0x182);
            goto LAB_00154981;
          }
          if (local_b8 == 3) {
            local_b8 = 4;
          }
          else {
            if (local_b8 != 0) {
              __assert_fail("!found",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                            ,0x17d,
                            "int xml_parse_data(struct ly_ctx *, struct lyxml_elem *, struct lyd_node *, struct lyd_node *, struct lyd_node *, int, struct unres_data *, struct lyd_node **, struct lyd_node **)"
                           );
            }
            local_b8 = 2;
          }
        }
      }
      else {
        iVar6 = strcmp(attr->name,"select");
        if (iVar6 == 0) {
          switch(local_b8) {
          case 0:
            local_b8 = 3;
            break;
          case 1:
            ly_vlog(LYE_INATTR,LY_VLOG_LYD,*result,attr->name);
            goto LAB_00154981;
          case 2:
            local_b8 = 4;
            break;
          case 3:
          case 4:
            ly_vlog(LYE_TOOMANY,LY_VLOG_LYD,*result,"select",parent_local->child);
            goto LAB_00154981;
          default:
            pLVar10 = ly_errno_location();
            *pLVar10 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
                   ,0x195);
            goto LAB_00154981;
          }
        }
      }
    }
    switch(local_b8) {
    case 1:
    case 4:
      goto LAB_0015450b;
    case 2:
      ly_vlog(LYE_MISSATTR,LY_VLOG_LYD,*result,"select",parent_local->child);
      break;
    case 3:
      ly_vlog(LYE_MISSATTR,LY_VLOG_LYD,*result,"type",parent_local->child);
      break;
    default:
      pLVar10 = ly_errno_location();
      *pLVar10 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_xml.c"
             ,0x1a8);
    }
  }
  else {
    iVar6 = lyp_check_edit_attr((ly_ctx *)xml_local,(*result)->attr,*result,&filterflag);
    if (iVar6 != 0) goto LAB_00154981;
LAB_0015450b:
    if ((target->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if ((target->nodetype & LYS_ANYDATA) == LYS_UNKNOWN) {
        if ((target->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
          if (target->nodetype == LYS_NOTIF) {
            if (((mod._4_4_ & 0x40) == 0) || (*act_notif != (lyd_node *)0x0)) {
              ly_vlog(LYE_INELEM,LY_VLOG_LYD,*result,target->name);
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Unexpected notification node \"%s\".",
                      target->name);
              goto LAB_00154981;
            }
            *act_notif = *result;
          }
        }
        else {
          if (((mod._4_4_ & 0x10) == 0) || (*act_notif != (lyd_node *)0x0)) {
            ly_vlog(LYE_INELEM,LY_VLOG_LYD,*result,target->name);
            pcVar11 = "action";
            if (target->nodetype == LYS_RPC) {
              pcVar11 = "rpc";
            }
            ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Unexpected %s node \"%s\".",pcVar11,
                    target->name);
            goto LAB_00154981;
          }
          *act_notif = *result;
        }
      }
      else if (parent_local->next == (lyd_node *)0x0) {
        *(undefined4 *)&(*result)->child = 0;
        plVar12 = (lys_node *)
                  lydict_insert((ly_ctx *)xml_local,*(char **)&parent_local[1].validity,0);
        (*result)[1].schema = plVar12;
      }
      else {
        _j = (lyxml_elem *)parent_local->next;
        parent_local->next = (lyd_node *)0x0;
        next = _j;
        for (; _j != (lyxml_elem *)0x0; _j = _j->next) {
          _j->parent = (lyxml_elem *)0x0;
          lyxml_correct_elem_ns((ly_ctx *)xml_local,_j,1,1);
        }
        *(undefined4 *)&(*result)->child = 8;
        (*result)[1].schema = (lys_node *)next;
      }
    }
    else {
      iVar6 = xml_get_value(*result,(lyxml_elem *)parent_local,filterflag);
      if (iVar6 != 0) goto LAB_00154981;
    }
    iVar6 = lyv_data_context(*result,mod._4_4_,unres);
    if (iVar6 == 0) {
      if ((editbits != 0) && (parent_local->next != (lyd_node *)0x0)) {
        schema = (lys_node *)0x0;
        dlast = (lyd_node *)0x0;
        next = (lyxml_elem *)parent_local->next;
        while (next != (lyxml_elem *)0x0) {
          _j = next->next;
          pos = xml_parse_data((ly_ctx *)xml_local,next,*result,(*result)->child,(lyd_node *)schema,
                               mod._4_4_,unres,&dlast,act_notif);
          if (pos != 0) goto LAB_00154981;
          if ((mod._4_4_ & 0x400) != 0) {
            lyxml_free((ly_ctx *)xml_local,next);
          }
          if ((dlast != (lyd_node *)0x0) && (dlast->next == (lyd_node *)0x0)) {
            schema = (lys_node *)dlast;
          }
          next = _j;
        }
      }
      if ((((target->nodetype == LYS_CONTAINER) && ((*result)->child == (lyd_node *)0x0)) &&
          ((*result)->attr == (lyd_attr *)0x0)) &&
         (lVar3._0_2_ = target[1].flags, lVar3._2_1_ = target[1].ext_size,
         lVar3._3_1_ = target[1].iffeature_size, lVar3._4_1_ = target[1].padding[0],
         lVar3._5_1_ = target[1].padding[1], lVar3._6_1_ = target[1].padding[2],
         lVar3._7_1_ = target[1].padding[3], lVar3 == 0)) {
        (*result)->field_0x9 = (*result)->field_0x9 & 0xfe | 1;
      }
      ly_err_clean(1);
      iVar6 = lyv_data_content(*result,mod._4_4_,unres);
      if (iVar6 == 0) {
        if (plStack_38 == (lyd_node *)0x0) {
          local_138 = (lyd_node **)0x0;
        }
        else {
          local_138 = &prev_local;
        }
        iVar6 = lyv_multicases(*result,(lys_node *)0x0,local_138,0,(lyd_node *)0x0);
        if (iVar6 == 0) {
          if (((*result)->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
            (*result)->validity = (*result)->validity | 1;
          }
          return 0;
        }
      }
      pLVar10 = ly_errno_location();
      if (*pLVar10 == LY_SUCCESS) goto LAB_00154990;
    }
  }
LAB_00154981:
  str._4_4_ = -1;
LAB_00154990:
  havechildren = unres->count;
  while (havechildren = havechildren - 1, -1 < havechildren) {
    if (unres->node[havechildren] == *result) {
      unres_data_del(unres,havechildren);
    }
  }
  lyd_free(*result);
  *result = (lyd_node *)0x0;
  return str._4_4_;
}

Assistant:

static int
xml_parse_data(struct ly_ctx *ctx, struct lyxml_elem *xml, struct lyd_node *parent, struct lyd_node *first_sibling,
               struct lyd_node *prev, int options, struct unres_data *unres, struct lyd_node **result,
               struct lyd_node **act_notif)
{
    const struct lys_module *mod = NULL;
    struct lyd_node *diter, *dlast;
    struct lys_node *schema = NULL, *target;
    struct lys_node_augment *aug;
    struct lyd_attr *dattr, *dattr_iter;
    struct lyxml_attr *attr;
    struct lyxml_elem *child, *next;
    int i, j, havechildren, r, editbits = 0, pos, filterflag = 0, found;
    int ret = 0;
    const char *str = NULL;

    assert(xml);
    assert(result);
    *result = NULL;

    if (xml->flags & LYXML_ELEM_MIXED) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "XML element with mixed content");
            return -1;
        } else {
            return 0;
        }
    }

    if (!xml->ns || !xml->ns->value) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_XML_MISS, LY_VLOG_XML, xml, "element's", "namespace");
            return -1;
        } else {
            return 0;
        }
    }

    /* find schema node */
    if (!parent) {
        mod = ly_ctx_get_module_by_ns(ctx, xml->ns->value, NULL);
        if (ctx->data_clb) {
            if (!mod) {
                mod = ctx->data_clb(ctx, NULL, xml->ns->value, 0, ctx->data_clb_data);
            } else if (!mod->implemented) {
                mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }

        /* get the proper schema node */
        if (mod && mod->implemented && !mod->disabled) {
            schema = xml_data_search_schemanode(xml, mod->data, options);
            if (!schema) {
                /* it still can be the specific case of this module containing an augment of another module
                * top-level choice or top-level choice's case, bleh */
                for (j = 0; j < mod->augment_size; ++j) {
                    aug = &mod->augment[j];
                    target = aug->target;
                    if (target->nodetype & (LYS_CHOICE | LYS_CASE)) {
                        /* 1) okay, the target is choice or case */
                        while (target && (target->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                            target = lys_parent(target);
                        }
                        /* 2) now, the data node will be top-level, there are only non-data schema nodes */
                        if (!target) {
                            while ((schema = (struct lys_node *)lys_getnext(schema, (struct lys_node *)aug, NULL, 0))) {
                                /* 3) alright, even the name matches, we found our schema node */
                                if (ly_strequal(schema->name, xml->name, 1)) {
                                    break;
                                }
                            }
                        }
                    }

                    if (schema) {
                        break;
                    }
                }
            }
        }
    } else {
        /* parsing some internal node, we start with parent's schema pointer */
        schema = xml_data_search_schemanode(xml, parent->schema->child, options);

        if (schema) {
            if (!lys_node_module(schema)->implemented && ctx->data_clb) {
                ctx->data_clb(ctx, lys_node_module(schema)->name, lys_node_module(schema)->ns,
                              LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
            }
        }
    }

    mod = lys_node_module(schema);
    if (!mod || !mod->implemented || mod->disabled) {
        if (options & LYD_OPT_STRICT) {
            LOGVAL(LYE_INELEM, (parent ? LY_VLOG_LYD : LY_VLOG_NONE), parent, xml->name);
            return -1;
        } else {
            return 0;
        }
    }

    /* create the element structure */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        *result = calloc(1, sizeof **result);
        havechildren = 1;
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        *result = calloc(1, sizeof(struct lyd_node_leaf_list));
        havechildren = 0;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        *result = calloc(1, sizeof(struct lyd_node_anydata));
        havechildren = 0;
        break;
    default:
        LOGINT;
        return -1;
    }
    if (!(*result)) {
        LOGMEM;
        return -1;
    }

    (*result)->prev = *result;
    (*result)->schema = schema;
    (*result)->parent = parent;
    diter = NULL;
    if (parent && parent->child && schema->nodetype == LYS_LEAF && parent->schema->nodetype == LYS_LIST &&
        (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)schema))) {
        /* it is key and we need to insert it into a correct place */
        for (i = 0, diter = parent->child;
                diter && i < (pos - 1) && diter->schema->nodetype == LYS_LEAF &&
                    lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)diter->schema);
                i++, diter = diter->next);
        if (diter) {
            /* out of order insertion - insert list's key to the correct position, before the diter */
            if (options & LYD_OPT_STRICT) {
                LOGVAL(LYE_INORDER, LY_VLOG_LYD, *result, schema->name, diter->schema->name);
                LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid position of the key \"%s\" in a list \"%s\".",
                       schema->name, parent->schema->name);
                free(*result);
                *result = NULL;
                return -1;
            } else {
                LOGWRN("Invalid position of the key \"%s\" in a list \"%s\".", schema->name, parent->schema->name)
            }
            if (parent->child == diter) {
                parent->child = *result;
                /* update first_sibling */
                first_sibling = *result;
            }
            if (diter->prev->next) {
                diter->prev->next = *result;
            }
            (*result)->prev = diter->prev;
            diter->prev = *result;
            (*result)->next = diter;
        }
    }
    if (!diter) {
        /* simplified (faster) insert as the last node */
        if (parent && !parent->child) {
            parent->child = *result;
        }
        if (prev) {
            (*result)->prev = prev;
            prev->next = *result;

            /* fix the "last" pointer */
            first_sibling->prev = *result;
        } else {
            (*result)->prev = *result;
            first_sibling = *result;
        }
    }
    (*result)->validity = ly_new_node_validity((*result)->schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        (*result)->when_status = LYD_WHEN;
    }

    /* process attributes */
    for (attr = xml->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_STD) {
            continue;
        } else if (!attr->ns) {
            if ((*result)->schema->nodetype == LYS_ANYXML &&
                    ly_strequal((*result)->schema->name, "filter", 0) &&
                    (ly_strequal((*result)->schema->module->name, "ietf-netconf", 0) ||
                    ly_strequal((*result)->schema->module->name, "notifications", 0))) {
                /* NETCONF filter's attributes, which we implement as non-standard annotations,
                 * they are unqualified (no namespace), but we know that we have internally defined
                 * them in the ietf-netconf module */
                str = "urn:ietf:params:xml:ns:netconf:base:1.0";
                filterflag = 1;
            } else {
                /* garbage */
                goto attr_error;
            }
        } else {
            str = attr->ns->value;
        }

        r = lyp_fill_attr(ctx, *result, str, NULL, attr->name, attr->value, xml, &dattr);
        if (r == -1) {
            goto error;
        } else if (r == 1) {
attr_error:
            if (options & LYD_OPT_STRICT) {
                LOGVAL(LYE_INMETA, LY_VLOG_LYD, *result, (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
                goto error;
            }

            LOGWRN("Unknown \"%s:%s\" metadata with value \"%s\", ignoring.",
                   (attr->ns ? attr->ns->prefix : "<none>"), attr->name, attr->value);
            continue;
        }

        /* special case of xpath in the value, we want to convert it to JSON */
        if (filterflag && !strcmp(attr->name, "select")) {
            dattr->value.string = transform_xml2json(ctx, dattr->value_str, xml, 0, 1);
            if (!dattr->value.string) {
                /* problem with resolving value as xpath */
                dattr->value.string = dattr->value_str;
                goto error;
            }
            lydict_remove(ctx, dattr->value_str);
            dattr->value_str = dattr->value.string;
        }

        /* insert into the data node */
        if (!(*result)->attr) {
            (*result)->attr = dattr;
        } else {
            for (dattr_iter = (*result)->attr; dattr_iter->next; dattr_iter = dattr_iter->next);
            dattr_iter->next = dattr;
        }
        continue;
    }

    /* check insert attribute and its values */
    if (options & LYD_OPT_EDIT) {
        if (lyp_check_edit_attr(ctx, (*result)->attr, *result, &editbits)) {
            goto error;
        }

    /* check correct filter extension attributes */
    } else if (filterflag) {
        found = 0; /* 0 - nothing, 1 - type subtree, 2 - type xpath, 3 - select, 4 - type xpath + select */
        LY_TREE_FOR((*result)->attr, dattr_iter) {
            if (!strcmp(dattr_iter->name, "type")) {
                if ((found == 1) || (found == 2) || (found == 4)) {
                    LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, (*result), "type", xml->name);
                    goto error;
                }
                switch (dattr_iter->value.enm->value) {
                case 0:
                    /* subtree */
                    if (found == 3) {
                        LOGVAL(LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                        goto error;
                    }

                    assert(!found);
                    found = 1;
                    break;
                case 1:
                    /* xpath */
                    if (found == 3) {
                        found = 4;
                    } else {
                        assert(!found);
                        found = 2;
                    }
                    break;
                default:
                    LOGINT;
                    goto error;
                }
            } else if (!strcmp(dattr_iter->name, "select")) {
                switch (found) {
                case 0:
                    found = 3;
                    break;
                case 1:
                    LOGVAL(LYE_INATTR, LY_VLOG_LYD, (*result), dattr_iter->name);
                    goto error;
                case 2:
                    found = 4;
                    break;
                case 3:
                case 4:
                    LOGVAL(LYE_TOOMANY, LY_VLOG_LYD, (*result), "select", xml->name);
                    goto error;
                default:
                    LOGINT;
                    goto error;
                }
            }
        }

        /* check if what we found is correct */
        switch (found) {
        case 1:
        case 4:
            /* ok */
            break;
        case 2:
            LOGVAL(LYE_MISSATTR, LY_VLOG_LYD, (*result), "select", xml->name);
            goto error;
        case 3:
            LOGVAL(LYE_MISSATTR, LY_VLOG_LYD, (*result), "type", xml->name);
            goto error;
        default:
            LOGINT;
            goto error;
        }
    }

    /* type specific processing */
    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* type detection and assigning the value */
        if (xml_get_value(*result, xml, editbits)) {
            goto error;
        }
    } else if (schema->nodetype & LYS_ANYDATA) {
        /* store children values */
        if (xml->child) {
            child = xml->child;
            /* manually unlink all siblings and correct namespaces */
            xml->child = NULL;
            LY_TREE_FOR(child, next) {
                next->parent = NULL;
                lyxml_correct_elem_ns(ctx, next, 1, 1);
            }

            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_XML;
            ((struct lyd_node_anydata *)*result)->value.xml = child;
        } else {
            ((struct lyd_node_anydata *)*result)->value_type = LYD_ANYDATA_CONSTSTRING;
            ((struct lyd_node_anydata *)*result)->value.str = lydict_insert(ctx, xml->content, 0);
        }
    } else if (schema->nodetype & (LYS_RPC | LYS_ACTION)) {
        if (!(options & LYD_OPT_RPC) || *act_notif) {
            LOGVAL(LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                   (schema->nodetype == LYS_RPC ? "rpc" : "action"), schema->name);
            goto error;
        }
        *act_notif = *result;
    } else if (schema->nodetype == LYS_NOTIF) {
        if (!(options & LYD_OPT_NOTIF) || *act_notif) {
            LOGVAL(LYE_INELEM, LY_VLOG_LYD, (*result), schema->name);
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected notification node \"%s\".", schema->name);
            goto error;
        }
        *act_notif = *result;
    }

    /* first part of validation checks */
    if (lyv_data_context(*result, options, unres)) {
        goto error;
    }

    /* process children */
    if (havechildren && xml->child) {
        diter = dlast = NULL;
        LY_TREE_FOR_SAFE(xml->child, next, child) {
            r = xml_parse_data(ctx, child, *result, (*result)->child, dlast, options, unres, &diter, act_notif);
            if (r) {
                goto error;
            } else if (options & LYD_OPT_DESTRUCT) {
                lyxml_free(ctx, child);
            }
            if (diter && !diter->next) {
                /* the child was parsed/created and it was placed as the last child. The child can be inserted
                 * out of order (not as the last one) in case it is a list's key present out of the correct order */
                dlast = diter;
            }
        }
    }

    /* if we have empty non-presence container, we keep it, but mark it as default */
    if (schema->nodetype == LYS_CONTAINER && !(*result)->child &&
            !(*result)->attr && !((struct lys_node_container *)schema)->presence) {
        (*result)->dflt = 1;
    }

    /* rest of validation checks */
    ly_err_clean(1);
    if (lyv_data_content(*result, options, unres) ||
             lyv_multicases(*result, NULL, prev ? &first_sibling : NULL, 0, NULL)) {
        if (ly_errno) {
            goto error;
        } else {
            goto clear;
        }
    }

    /* validation successful */
    if ((*result)->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* postpone checking when there will be all list/leaflist instances */
        (*result)->validity |= LYD_VAL_UNIQUE;
    }

    return ret;

error:
    ret--;

clear:
    /* cleanup */
    for (i = unres->count - 1; i >= 0; i--) {
        /* remove unres items connected with the node being removed */
        if (unres->node[i] == *result) {
            unres_data_del(unres, i);
        }
    }
    lyd_free(*result);
    *result = NULL;

    return ret;
}